

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O2

int webSocket_buildRespondShakeKey(uchar *acceptKey,uint acceptKeyLen,uchar *respondKey)

{
  int iVar1;
  int iVar2;
  char *source;
  char *__s;
  size_t sVar3;
  uchar *bindata;
  long lVar4;
  uchar *puVar5;
  
  if (acceptKey != (uchar *)0x0) {
    source = (char *)calloc(1,(ulong)(acceptKeyLen + 0x2f));
    memcpy(source,acceptKey,(ulong)acceptKeyLen);
    builtin_strncpy(source + acceptKeyLen,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11",0x25);
    source[acceptKeyLen + 0x25] = '\0';
    __s = sha1_hash(source);
    sVar3 = strlen(__s);
    iVar2 = (int)((long)((ulong)(uint)((int)sVar3 >> 0x1f) << 0x20 | sVar3 & 0xffffffff) / 2);
    bindata = (uchar *)calloc(1,(long)(iVar2 + 1));
    puVar5 = bindata;
    for (lVar4 = 0; lVar4 < (int)sVar3; lVar4 = lVar4 + 2) {
      iVar1 = htoi(__s,(int)lVar4,2);
      *puVar5 = (uchar)iVar1;
      puVar5 = puVar5 + 1;
    }
    iVar2 = base64_encode(bindata,(char *)respondKey,iVar2);
    free(__s);
    free(bindata);
    free(source);
    return iVar2;
  }
  return 0;
}

Assistant:

int webSocket_buildRespondShakeKey(unsigned char *acceptKey, unsigned int acceptKeyLen, unsigned char *respondKey) {
    char *clientKey;
    char *sha1DataTemp;
    char *sha1Data;
    int i, n;
    const char GUID[] = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    unsigned int GUIDLEN;

    if(acceptKey == NULL)
        return 0;
    GUIDLEN = sizeof(GUID);
    clientKey = (char *)calloc(1, sizeof(char)*(acceptKeyLen + GUIDLEN + 10));
    memset(clientKey, 0, (acceptKeyLen + GUIDLEN + 10));
    //
    memcpy(clientKey, acceptKey, acceptKeyLen);
    memcpy(&clientKey[acceptKeyLen], GUID, GUIDLEN);
    clientKey[acceptKeyLen + GUIDLEN] = '\0';
    //
    sha1DataTemp = sha1_hash(clientKey);
    n = strlen(sha1DataTemp);
    sha1Data = (char *)calloc(1, n / 2 + 1);
    memset(sha1Data, 0, n / 2 + 1);
    //
    for(i = 0; i < n; i += 2)
        sha1Data[ i / 2 ] = htoi(sha1DataTemp, i, 2);
    n = base64_encode((const unsigned char *)sha1Data, (char *)respondKey, (n / 2));
    //
    free(sha1DataTemp);
    free(sha1Data);
    free(clientKey);
    return n;
}